

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::Sphere::ToString_abi_cxx11_(Sphere *this)

{
  bool *unaff_RBX;
  string *in_RDI;
  bool *unaff_R14;
  Transform *unaff_R15;
  Transform *unaff_retaddr;
  char *in_stack_00000008;
  float *in_stack_00000048;
  float *in_stack_00000050;
  float *in_stack_00000058;
  float *in_stack_00000060;
  float *in_stack_00000068;
  
  StringPrintf<pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
            (in_stack_00000008,unaff_retaddr,unaff_R15,unaff_R14,unaff_RBX,&this->radius,
             in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060,
             in_stack_00000068);
  return in_RDI;
}

Assistant:

std::string Sphere::ToString() const {
    return StringPrintf("[ Sphere renderFromObject: %s "
                        "objectFromRender: %s reverseOrientation: %s "
                        "transformSwapsHandedness: %s radius: %f zMin: %f "
                        "zMax: %f thetaMin: %f "
                        "thetaMax: %f phiMax: %f ]",
                        *renderFromObject, *objectFromRender, reverseOrientation,
                        transformSwapsHandedness, radius, zMin, zMax, thetaZMin,
                        thetaZMax, phiMax);
}